

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStruct
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *pFVar1;
  EnumDef *pEVar2;
  GoGenerator *this_00;
  long *plVar3;
  long *plVar4;
  pointer ppFVar5;
  long *local_e0;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  GoGenerator *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  IdlNamer *local_58;
  string local_50;
  
  local_58 = &this->namer_;
  local_80 = this;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_a0,local_58,struct_def);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x374907);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_b0 = *plVar4;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0 = &local_d0;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_d0 = *plVar4;
    lStack_c8 = plVar3[3];
  }
  else {
    local_d0 = *plVar4;
    local_e0 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  for (ppFVar5 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar5 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar5 = ppFVar5 + 1) {
    pFVar1 = *ppFVar5;
    if ((pFVar1->deprecated == false) &&
       (((0xb < (pFVar1->value).type.base_type - BASE_TYPE_UTYPE ||
         (pEVar2 = (pFVar1->value).type.enum_def, pEVar2 == (EnumDef *)0x0)) ||
        (pEVar2->is_union == false)))) {
      (*(local_58->super_Namer)._vptr_Namer[0x12])(&local_a0,local_58,pFVar1);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x374c6a);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_b0 = *plVar4;
        lStack_a8 = plVar3[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar4;
        local_c0 = (long *)*plVar3;
      }
      local_b8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_e0 = &local_d0;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_d0 = *plVar4;
        lStack_c8 = plVar3[3];
      }
      else {
        local_d0 = *plVar4;
        local_e0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (((pFVar1->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
         (pFVar1->presence == kOptional)) {
        std::__cxx11::string::append((char *)code_ptr);
      }
      NativeType_abi_cxx11_(&local_50,local_80,&(pFVar1->value).type);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_78 = &local_68;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_68 = *plVar4;
        lStack_60 = plVar3[3];
      }
      else {
        local_68 = *plVar4;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,
                                  (ulong)(pFVar1->super_Definition).name._M_dataplus._M_p);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar3[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar3;
      }
      local_98 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_b0 = *plVar4;
        lStack_a8 = plVar3[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar4;
        local_c0 = (long *)*plVar3;
      }
      local_b8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_e0 = &local_d0;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_d0 = *plVar4;
        lStack_c8 = plVar3[3];
      }
      else {
        local_d0 = *plVar4;
        local_e0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  this_00 = local_80;
  if (struct_def->fixed == false) {
    GenNativeTablePack(local_80,struct_def,code_ptr);
    GenNativeTableUnPack(this_00,struct_def,code_ptr);
  }
  else {
    GenNativeStructPack(local_80,struct_def,code_ptr);
    GenNativeStructUnPack(this_00,struct_def,code_ptr);
  }
  return;
}

Assistant:

void GenNativeStruct(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "type " + NativeName(struct_def) + " struct {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      if (IsScalar(field.value.type.base_type) &&
          field.value.type.enum_def != nullptr &&
          field.value.type.enum_def->is_union)
        continue;
      code += "\t" + namer_.Field(field) + " ";
      if (field.IsScalarOptional()) { code += "*"; }
      code += NativeType(field.value.type) + " `json:\"" + field.name + "\"`" +
              "\n";
    }
    code += "}\n\n";

    if (!struct_def.fixed) {
      GenNativeTablePack(struct_def, code_ptr);
      GenNativeTableUnPack(struct_def, code_ptr);
    } else {
      GenNativeStructPack(struct_def, code_ptr);
      GenNativeStructUnPack(struct_def, code_ptr);
    }
  }